

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O1

int32_t ucase_toFullFolding_63(UChar32 c,UChar **pString,uint32_t options)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  sbyte sVar8;
  uint uVar9;
  uint uVar10;
  ushort *puVar11;
  UChar32 result;
  long lVar12;
  
  if ((uint)c < 0xd800) {
    uVar10 = (uint)c >> 5;
LAB_0018c99e:
    uVar7 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar10] * 4);
  }
  else {
    if ((uint)c < 0x10000) {
      uVar10 = ((uint)c >> 5) + 0x140;
      if (0xdbff < c) {
        uVar10 = (uint)c >> 5;
      }
      goto LAB_0018c99e;
    }
    uVar7 = 0xd30;
    if (((uint)c < 0x110000) && (uVar7 = 0x2f1c, c < 0xe0800)) {
      uVar10 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
      goto LAB_0018c99e;
    }
  }
  uVar2 = ucase_props_trieIndex[uVar7];
  uVar10 = c;
  if ((uVar2 & 8) == 0) {
    if ((uVar2 & 2) != 0) {
      uVar10 = ((int)(short)uVar2 >> 7) + c;
    }
    goto LAB_0018cb7d;
  }
  lVar1 = (ulong)(uVar2 >> 4) * 2;
  lVar12 = lVar1 + 0x1ee5c2;
  uVar3 = ucase_props_exceptions[uVar2 >> 4];
  uVar9 = (uint)uVar3;
  if ((short)uVar3 < 0) {
    if ((options & 7) != 0) {
      if (c == 0x49) {
        uVar6 = 0x131;
        goto LAB_0018cb75;
      }
      if (c != 0x130) goto LAB_0018cad6;
LAB_0018cb22:
      uVar6 = 0x69;
      goto LAB_0018cb75;
    }
    if (c == 0x49) goto LAB_0018cb22;
    if (c != 0x130) goto LAB_0018cad6;
    *pString = L"i̇";
    uVar6 = 2;
    uVar10 = 0x130;
    bVar5 = false;
  }
  else {
    if ((char)uVar3 < '\0') {
      puVar11 = (ushort *)(lVar1 + 0x1ee5c4 + (ulong)""[uVar9 & 0x7f] * 4);
      if ((uVar3 >> 8 & 1) == 0) {
        puVar11 = (ushort *)(lVar12 + (ulong)""[uVar9 & 0x7f] * 2);
      }
      uVar4 = *puVar11 >> 4;
      uVar6 = uVar4 & 0xf;
      if ((uVar4 & 0xf) != 0) {
        *pString = (UChar *)(puVar11 + (ulong)(*puVar11 & 0xf) + 1);
        goto LAB_0018cb75;
      }
    }
LAB_0018cad6:
    if ((uVar3 >> 9 & 1) == 0) {
      if (((uVar2 & 2) != 0) && ((uVar3 & 0x10) != 0)) {
        uVar7 = (ulong)""[uVar9 & 0xf];
        if ((uVar3 >> 8 & 1) == 0) {
          uVar9 = (uint)*(ushort *)(lVar12 + uVar7 * 2);
        }
        else {
          uVar9 = CONCAT22(*(undefined2 *)(lVar12 + uVar7 * 4),
                           *(undefined2 *)(lVar1 + 0x1ee5c4 + uVar7 * 4));
        }
        uVar6 = -uVar9;
        if ((uVar3 >> 10 & 1) == 0) {
          uVar6 = uVar9;
        }
        uVar6 = uVar6 + c;
        goto LAB_0018cb75;
      }
      sVar8 = 1;
      if (((uVar3 & 2) != 0) || (sVar8 = 0, (uVar3 & 1) != 0)) {
        uVar7 = (ulong)""[uVar9 & ~(-1 << sVar8)];
        uVar6 = (uint)""[uVar9 & ~(-1 << sVar8)];
        if ((uVar3 >> 8 & 1) == 0) {
          uVar10 = (uint)*(ushort *)(lVar12 + uVar7 * 2);
        }
        else {
          uVar10 = CONCAT22(*(undefined2 *)(lVar12 + uVar7 * 4),
                            *(undefined2 *)(lVar1 + 0x1ee5c4 + uVar7 * 4));
        }
        bVar5 = true;
        goto LAB_0018cb79;
      }
    }
    uVar6 = ~c;
LAB_0018cb75:
    bVar5 = false;
  }
LAB_0018cb79:
  if (!bVar5) {
    return uVar6;
  }
LAB_0018cb7d:
  return -(uint)(uVar10 == c) ^ uVar10;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucase_toFullFolding(UChar32 c,
                    const UChar **pString,
                    uint32_t options) {
    // The sign of the result has meaning, input must be non-negative so that it can be returned as is.
    U_ASSERT(c >= 0);
    UChar32 result=c;
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_IS_UPPER_OR_TITLE(props)) {
            result=c+UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props), *pe2;
        uint16_t excWord=*pe++;
        int32_t full, idx;

        pe2=pe;

        if(excWord&UCASE_EXC_CONDITIONAL_FOLD) {
            /* use hardcoded conditions and mappings */
            if((options&_FOLD_CASE_OPTIONS_MASK)==U_FOLD_CASE_DEFAULT) {
                /* default mappings */
                if(c==0x49) {
                    /* 0049; C; 0069; # LATIN CAPITAL LETTER I */
                    return 0x69;
                } else if(c==0x130) {
                    /* 0130; F; 0069 0307; # LATIN CAPITAL LETTER I WITH DOT ABOVE */
                    *pString=iDot;
                    return 2;
                }
            } else {
                /* Turkic mappings */
                if(c==0x49) {
                    /* 0049; T; 0131; # LATIN CAPITAL LETTER I */
                    return 0x131;
                } else if(c==0x130) {
                    /* 0130; T; 0069; # LATIN CAPITAL LETTER I WITH DOT ABOVE */
                    return 0x69;
                }
            }
        } else if(HAS_SLOT(excWord, UCASE_EXC_FULL_MAPPINGS)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_FULL_MAPPINGS, pe, full);

            /* start of full case mapping strings */
            ++pe;

            /* skip the lowercase result string */
            pe+=full&UCASE_FULL_LOWER;
            full=(full>>4)&0xf;

            if(full!=0) {
                /* set the output pointer to the result string */
                *pString=reinterpret_cast<const UChar *>(pe);

                /* return the string length */
                return full;
            }
        }

        if((excWord&UCASE_EXC_NO_SIMPLE_CASE_FOLDING)!=0) {
            return ~c;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_IS_UPPER_OR_TITLE(props)) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe2, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_FOLD)) {
            idx=UCASE_EXC_FOLD;
        } else if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
            idx=UCASE_EXC_LOWER;
        } else {
            return ~c;
        }
        GET_SLOT_VALUE(excWord, idx, pe2, result);
    }

    return (result==c) ? ~result : result;
}